

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numericsort.c
# Opt level: O3

int numericsort(dirent **A,dirent **B,int cs)

{
  byte *pbVar1;
  byte bVar2;
  ushort *puVar3;
  long lVar4;
  int iVar5;
  ushort **ppuVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  
  pbVar12 = (byte *)((long)A + 0x13);
  pbVar13 = (byte *)((long)B + 0x13);
  ppuVar6 = __ctype_b_loc();
  puVar3 = *ppuVar6;
  while( true ) {
    uVar11 = 0;
    while( true ) {
      bVar2 = *pbVar12;
      iVar10 = (int)(char)bVar2;
      if (((*(byte *)((long)puVar3 + (ulong)(uint)bVar2 * 2 + 1) & 8) == 0) ||
         ((*(byte *)((long)puVar3 + (ulong)*pbVar13 * 2 + 1) & 8) == 0)) break;
      pbVar12 = pbVar12 + -1;
      do {
        uVar9 = (ulong)pbVar12[1];
        pbVar12 = pbVar12 + 1;
      } while (uVar9 == 0x30);
      pbVar13 = pbVar13 + -1;
      do {
        pbVar1 = pbVar13 + 1;
        pbVar13 = pbVar13 + 1;
      } while (*pbVar1 == 0x30);
      while (((*(byte *)((long)puVar3 + uVar9 * 2 + 1) & 8) != 0 && ((byte)uVar9 == *pbVar13))) {
        pbVar13 = pbVar13 + 1;
        pbVar1 = pbVar12 + 1;
        pbVar12 = pbVar12 + 1;
        uVar9 = (ulong)*pbVar1;
      }
      uVar7 = 0;
      uVar8 = 0;
      if (((*(byte *)((long)puVar3 + uVar9 * 2 + 1) & 8) != 0) &&
         (uVar8 = (int)(char)(byte)uVar9 - (int)(char)*pbVar13,
         (*(byte *)((long)puVar3 + (ulong)*pbVar13 * 2 + 1) & 8) == 0)) {
        uVar8 = 0;
      }
      if ((*(byte *)((long)puVar3 + uVar9 * 2 + 1) & 8) != 0) {
        uVar7 = 0;
        do {
          lVar4 = uVar7 + 1;
          uVar7 = uVar7 + 1;
        } while ((*(byte *)((long)puVar3 + (ulong)pbVar12[lVar4] * 2 + 1) & 8) != 0);
        pbVar12 = pbVar12 + uVar7;
      }
      bVar2 = *pbVar13;
      while (iVar5 = (int)uVar7, (*(byte *)((long)puVar3 + (ulong)bVar2 * 2 + 1) & 8) != 0) {
        uVar7 = (ulong)(iVar5 - 1);
        bVar2 = pbVar13[1];
        pbVar13 = pbVar13 + 1;
      }
      if (uVar8 != 0) {
        uVar11 = (ulong)uVar8;
      }
      if (iVar5 != 0) {
        uVar11 = uVar7 & 0xffffffff;
      }
      iVar10 = (int)uVar11;
      if (iVar5 != 0 || uVar8 != 0) goto LAB_001fabbe;
    }
    if (cs == 0) {
      iVar10 = tolower((uint)bVar2);
      iVar5 = tolower((uint)*pbVar13);
    }
    else {
      iVar5 = (int)(char)*pbVar13;
    }
    iVar10 = iVar10 - iVar5;
    if (iVar10 != 0) break;
    if (bVar2 == 0) {
      return 0;
    }
    pbVar12 = pbVar12 + 1;
    pbVar13 = pbVar13 + 1;
  }
LAB_001fabbe:
  if (iVar10 == 0) {
    return 0;
  }
  return iVar10 >> 0x1f | 1;
}

Assistant:

static int numericsort(struct dirent **A, struct dirent **B, int cs) {
  const char* a = (*A)->d_name;
  const char* b = (*B)->d_name;
  int ret = 0;
  for (;;) {
    if (isdigit(*a & 255) && isdigit(*b & 255)) {
      int diff,magdiff;
      while (*a == '0') a++;
      while (*b == '0') b++;
      while (isdigit(*a & 255) && *a == *b) {a++; b++;}
      diff = (isdigit(*a & 255) && isdigit(*b & 255)) ? *a - *b : 0;
      magdiff = 0;
      while (isdigit(*a & 255)) {magdiff++; a++;}
      while (isdigit(*b & 255)) {magdiff--; b++;}
      if (magdiff) {ret = magdiff; break;} /* compare # of significant digits*/
      if (diff) {ret = diff; break;}	/* compare first non-zero digit */
    } else {
      if (cs) {
      	/* compare case-sensitive */
	if ((ret = *a-*b)) break;
      } else {
	/* compare case-insensitve */
	if ((ret = tolower(*a & 255)-tolower(*b & 255))) break;
      }

      if (!*a) break;
      a++; b++;
    }
  }
  if (!ret) return 0;
  else return (ret < 0) ? -1 : 1;
}